

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

int nni_sock_create(nni_sock **sp,nni_proto *proto)

{
  undefined6 uVar1;
  size_t sz;
  nni_sock *pnStack_30;
  _Bool on;
  nni_sock *s;
  nni_proto *pnStack_20;
  int rv;
  nni_proto *proto_local;
  nni_sock **sp_local;
  
  pnStack_20 = proto;
  proto_local = (nni_proto *)sp;
  pnStack_30 = (nni_sock *)nni_zalloc(proto->proto_sock_ops->sock_size + 0x558);
  if (pnStack_30 == (nni_sock *)0x0) {
    sp_local._4_4_ = 2;
  }
  else {
    pnStack_30->s_data = pnStack_30 + 1;
    pnStack_30->s_sndtimeo = -1;
    pnStack_30->s_rcvtimeo = -1;
    pnStack_30->s_reconn = 1000;
    pnStack_30->s_reconnmax = 0;
    pnStack_30->s_rcvmaxsz = 0;
    pnStack_30->s_id = 0;
    pnStack_30->s_ref = 0;
    uVar1 = *(undefined6 *)&(pnStack_20->proto_self).field_0x2;
    (pnStack_30->s_self_id).p_id = (pnStack_20->proto_self).p_id;
    *(undefined6 *)&(pnStack_30->s_self_id).field_0x2 = uVar1;
    (pnStack_30->s_self_id).p_name = (pnStack_20->proto_self).p_name;
    uVar1 = *(undefined6 *)&(pnStack_20->proto_peer).field_0x2;
    (pnStack_30->s_peer_id).p_id = (pnStack_20->proto_peer).p_id;
    *(undefined6 *)&(pnStack_30->s_peer_id).field_0x2 = uVar1;
    (pnStack_30->s_peer_id).p_name = (pnStack_20->proto_peer).p_name;
    pnStack_30->s_flags = pnStack_20->proto_flags;
    memcpy(&pnStack_30->s_sock_ops,pnStack_20->proto_sock_ops,0x50);
    memcpy(&pnStack_30->s_pipe_ops,pnStack_20->proto_pipe_ops,0x30);
    pnStack_30->s_closed = false;
    pnStack_30->s_closing = false;
    if (pnStack_20->proto_ctx_ops != (nni_proto_ctx_ops *)0x0) {
      memcpy(&pnStack_30->s_ctx_ops,pnStack_20->proto_ctx_ops,0x30);
    }
    if ((pnStack_30->s_sock_ops).sock_open == (_func_void_void_ptr *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/socket.c",
                0x212,"s->s_sock_ops.sock_open != NULL");
    }
    if ((pnStack_30->s_sock_ops).sock_close == (_func_void_void_ptr *)0x0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/socket.c",
                0x213,"s->s_sock_ops.sock_close != NULL");
    }
    (pnStack_30->s_node).ln_next = (nni_list_node *)0x0;
    (pnStack_30->s_node).ln_prev = (nni_list_node *)0x0;
    nni_list_init_offset(&pnStack_30->s_ctxs,0);
    nni_list_init_offset(&pnStack_30->s_pipes,0x98);
    nni_list_init_offset(&pnStack_30->s_listeners,0x80);
    nni_list_init_offset(&pnStack_30->s_dialers,0x70);
    nni_mtx_init(&pnStack_30->s_mx);
    nni_mtx_init(&pnStack_30->s_pipe_cbs_mtx);
    nni_cv_init(&pnStack_30->s_cv,&pnStack_30->s_mx);
    nni_cv_init(&pnStack_30->s_close_cv,&sock_lk);
    sock_stats_init(pnStack_30);
    s._4_4_ = nni_msgq_init(&pnStack_30->s_uwq,0);
    if ((s._4_4_ == 0) && (s._4_4_ = nni_msgq_init(&pnStack_30->s_urq,1), s._4_4_ == 0)) {
      (*(pnStack_30->s_sock_ops).sock_init)(pnStack_30->s_data,pnStack_30);
      nni_sock_setopt(pnStack_30,"send-timeout",&pnStack_30->s_sndtimeo,4,NNI_TYPE_DURATION);
      nni_sock_setopt(pnStack_30,"recv-timeout",&pnStack_30->s_rcvtimeo,4,NNI_TYPE_DURATION);
      nni_sock_setopt(pnStack_30,"recv-size-max",&pnStack_30->s_rcvmaxsz,8,NNI_TYPE_SIZE);
      sz._7_1_ = 1;
      nni_sock_setopt(pnStack_30,"tcp-nodelay",(void *)((long)&sz + 7),1,NNI_TYPE_BOOL);
      sz._7_1_ = 0;
      nni_sock_setopt(pnStack_30,"tcp-keepalive",(void *)((long)&sz + 7),1,NNI_TYPE_BOOL);
      *(nni_sock **)proto_local = pnStack_30;
      return s._4_4_;
    }
    sock_destroy(pnStack_30);
    sp_local._4_4_ = s._4_4_;
  }
  return sp_local._4_4_;
}

Assistant:

static int
nni_sock_create(nni_sock **sp, const nni_proto *proto)
{
	int       rv;
	nni_sock *s;
	bool      on;
	size_t    sz;

	sz = NNI_ALIGN_UP(sizeof(*s)) + proto->proto_sock_ops->sock_size;
	if ((s = nni_zalloc(sz)) == NULL) {
		return (NNG_ENOMEM);
	}
	s->s_data      = s + 1;
	s->s_sndtimeo  = -1;
	s->s_rcvtimeo  = -1;
	s->s_reconn    = NNI_SECOND;
	s->s_reconnmax = 0;
	s->s_rcvmaxsz  = 0; // unlimited by default
	s->s_id        = 0;
	s->s_ref       = 0;
	s->s_self_id   = proto->proto_self;
	s->s_peer_id   = proto->proto_peer;
	s->s_flags     = proto->proto_flags;
	s->s_sock_ops  = *proto->proto_sock_ops;
	s->s_pipe_ops  = *proto->proto_pipe_ops;
	s->s_closed    = false;
	s->s_closing   = false;

	if (proto->proto_ctx_ops != NULL) {
		s->s_ctx_ops = *proto->proto_ctx_ops;
	}

	NNI_ASSERT(s->s_sock_ops.sock_open != NULL);
	NNI_ASSERT(s->s_sock_ops.sock_close != NULL);

	NNI_LIST_NODE_INIT(&s->s_node);
	NNI_LIST_INIT(&s->s_ctxs, nni_ctx, c_node);
	NNI_LIST_INIT(&s->s_pipes, nni_pipe, p_sock_node);
	NNI_LIST_INIT(&s->s_listeners, nni_listener, l_node);
	NNI_LIST_INIT(&s->s_dialers, nni_dialer, d_node);
	nni_mtx_init(&s->s_mx);
	nni_mtx_init(&s->s_pipe_cbs_mtx);
	nni_cv_init(&s->s_cv, &s->s_mx);
	nni_cv_init(&s->s_close_cv, &sock_lk);

#ifdef NNG_ENABLE_STATS
	sock_stats_init(s);
#endif

	if (((rv = nni_msgq_init(&s->s_uwq, 0)) != 0) ||
	    ((rv = nni_msgq_init(&s->s_urq, 1)) != 0)) {
		sock_destroy(s);
		return (rv);
	}
	s->s_sock_ops.sock_init(s->s_data, s);

	// These we *attempt* to set so that we are likely to have initial
	// values loaded.  They should not fail, but if they do we don't
	// worry about it.
	(void) nni_sock_setopt(s, NNG_OPT_SENDTIMEO, &s->s_sndtimeo,
	    sizeof(nni_duration), NNI_TYPE_DURATION);
	(void) nni_sock_setopt(s, NNG_OPT_RECVTIMEO, &s->s_rcvtimeo,
	    sizeof(nni_duration), NNI_TYPE_DURATION);
	(void) nni_sock_setopt(s, NNG_OPT_RECVMAXSZ, &s->s_rcvmaxsz,
	    sizeof(size_t), NNI_TYPE_SIZE);

	on = true;
	(void) nni_sock_setopt(
	    s, NNG_OPT_TCP_NODELAY, &on, sizeof(on), NNI_TYPE_BOOL);
	on = false;
	(void) nni_sock_setopt(
	    s, NNG_OPT_TCP_KEEPALIVE, &on, sizeof(on), NNI_TYPE_BOOL);

	*sp = s;
	return (rv);
}